

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_ssadd16_riscv32(void *d,void *a,void *b,uint32_t desc)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    sVar1 = *(short *)((long)a + uVar4);
    sVar2 = *(short *)((long)b + uVar4);
    uVar5 = sVar1 + sVar2;
    if (SCARRY2(sVar1,sVar2)) {
      uVar5 = (short)(sVar1 + sVar2) >> 0xf ^ 0x8000;
    }
    *(ushort *)((long)d + uVar4) = uVar5;
    uVar4 = uVar4 + 2;
  } while (uVar4 < uVar3 + 8);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_ssadd16_riscv32_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_ssadd16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int r = *(int16_t *)((char *)a + i) + *(int16_t *)((char *)b + i);
        if (r > INT16_MAX) {
            r = INT16_MAX;
        } else if (r < INT16_MIN) {
            r = INT16_MIN;
        }
        *(int16_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}